

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistwidget.cpp
# Opt level: O1

void QListWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  QModelIndex *pQVar4;
  ScrollHint hint;
  QListWidgetItem *item;
  long in_FS_OFFSET;
  undefined8 local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_60 = *_a[1];
    local_58.i = (quintptr)&local_60;
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 0;
    break;
  case 1:
    local_60 = *_a[1];
    local_58.i = (quintptr)&local_60;
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 1;
    break;
  case 2:
    local_60 = *_a[1];
    local_58.i = (quintptr)&local_60;
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 2;
    break;
  case 3:
    local_60 = *_a[1];
    local_58.i = (quintptr)&local_60;
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 3;
    break;
  case 4:
    local_60 = *_a[1];
    local_58.i = (quintptr)&local_60;
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 4;
    break;
  case 5:
    local_60 = *_a[1];
    local_58.i = (quintptr)&local_60;
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 5;
    break;
  case 6:
    currentItemChanged((QListWidget *)_o,*_a[1],*_a[2]);
    goto switchD_0058988c_default;
  case 7:
    local_58.i = (quintptr)_a[1];
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 7;
    break;
  case 8:
    local_58.i = (quintptr)&local_60;
    local_60 = CONCAT44(local_60._4_4_,*_a[1]);
    pQVar4 = &local_58;
    local_58.r = 0;
    local_58.c = 0;
    iVar3 = 8;
    break;
  case 9:
    iVar3 = 9;
    pQVar4 = (QModelIndex *)0x0;
    break;
  case 10:
    item = *_a[1];
    hint = *_a[2];
    goto LAB_00589a85;
  case 0xb:
    item = *_a[1];
    hint = EnsureVisible;
LAB_00589a85:
    scrollToItem((QListWidget *)_o,item,hint);
    goto switchD_0058988c_default;
  case 0xc:
    clear((QListWidget *)_o);
  default:
    goto switchD_0058988c_default;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar3,(void **)pQVar4);
switchD_0058988c_default:
  if (_c == ReadProperty) {
switchD_00589870_caseD_1:
    piVar2 = (int *)*_a;
    if (_id == 2) {
      *(undefined1 *)piVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x5c0);
    }
    else {
      if (_id == 1) {
        QAbstractItemView::currentIndex(&local_58,(QAbstractItemView *)_o);
        iVar3 = local_58.r;
      }
      else {
        if (_id != 0) goto LAB_00589ca2;
        local_58.r = -1;
        local_58.c = -1;
        local_58.i = 0;
        local_58.m.ptr = (QAbstractItemModel *)0x0;
        iVar3 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x78))();
      }
      *piVar2 = iVar3;
    }
LAB_00589ca2:
    if (_c != WriteProperty) goto switchD_00589870_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_00589870_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == itemPressed) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == itemClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == itemDoubleClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == itemActivated) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == itemEntered) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 4;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == itemChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 5;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == currentItemChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 6;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == currentTextChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 7;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == currentRowChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 8;
      goto switchD_00589870_caseD_3;
    }
    if (((code *)*plVar1 == itemSelectionChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 9;
      goto switchD_00589870_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_00589870_caseD_3;
      goto switchD_00589870_caseD_1;
    }
  }
  if (_id == 2) {
    *(char *)(*(long *)(_o + 8) + 0x5c0) = (char)**_a;
  }
  else if (_id == 1) {
    setCurrentRow((QListWidget *)_o,**_a);
  }
switchD_00589870_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[2]))); break;
        case 7: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1]))); break;
        case 12: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * , QListWidgetItem * )>(_a, &QListWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(const QString & )>(_a, &QListWidget::currentTextChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(int )>(_a, &QListWidget::currentRowChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)()>(_a, &QListWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentRow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentRow(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}